

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntryFromCharCode(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  char16 cVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptString *pJVar7;
  char16 *pcVar8;
  charcount_t length;
  uint idxArg;
  long lVar9;
  int in_stack_00000010;
  CallInfo local_58;
  CallInfo callInfo_local;
  BufferStringBuilder builder;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_58 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x3be,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bbc561;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&builder,&local_58,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_58 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x3c1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bbc561:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((uint)builder.m_string & 0xffffff) != 0) {
    length = ((uint)builder.m_string & 0xffffff) - 1;
    if (length == 1) {
      pvVar6 = Arguments::operator[]((Arguments *)&builder,1);
      cVar4 = JavascriptConversion::ToUInt16(pvVar6,pSVar1);
      pJVar7 = CharStringCache::GetStringForChar
                         (&((pSVar1->super_ScriptContextBase).javascriptLibrary)->charStringCache,
                          cVar4);
    }
    else {
      callInfo_local = (CallInfo)BufferStringBuilder::WritableString::New(length,pSVar1);
      pcVar8 = BufferStringBuilder::DangerousGetWritableBuffer
                         ((BufferStringBuilder *)&callInfo_local);
      lVar9 = 0;
      while( true ) {
        idxArg = (uint)(lVar9 + 1);
        if (((uint)builder.m_string & 0xffffff) <= idxArg) break;
        pvVar6 = Arguments::operator[]((Arguments *)&builder,idxArg);
        cVar4 = JavascriptConversion::ToUInt16(pvVar6,pSVar1);
        pcVar8[lVar9] = cVar4;
        lVar9 = lVar9 + 1;
      }
      pJVar7 = BufferStringBuilder::ToString((BufferStringBuilder *)&callInfo_local);
    }
    return pJVar7;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec3f,L"String.fromCharCode");
}

Assistant:

Var JavascriptString::EntryFromCharCode(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        //
        // Construct a new string instance to contain all of the explicit parameters:
        // - Don't include the 'this' parameter.
        //
        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.fromCharCode"));
        }
        AssertMsg(args.Info.Count > 0, "Negative argument count");

        int charLength = args.Info.Count - 1;

        // Special case for single char
        if( charLength == 1 )
        {
            char16 ch = JavascriptConversion::ToUInt16(args[1], scriptContext);
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(ch);
        }

        BufferStringBuilder builder(charLength,scriptContext);
        char16 * stringBuffer = builder.DangerousGetWritableBuffer();

        //
        // Call ToUInt16 for each parameter, storing the character at the appropriate position.
        //

        for (uint idxArg = 1; idxArg < args.Info.Count; idxArg++)
        {
            *stringBuffer++ = JavascriptConversion::ToUInt16(args[idxArg], scriptContext);
        }

        //
        // Return the new string instance.
        //
        return builder.ToString();
    }